

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCastDecimalToNumeric<int,duckdb::hugeint_t>
               (int input,hugeint_t *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  string *msg;
  undefined7 in_register_00000009;
  PhysicalType params_1;
  long lVar2;
  string error;
  Exception local_68;
  undefined1 local_58 [16];
  string local_48;
  
  lVar2 = (-(ulong)((uint)input >> 0x1f) ^
          *(ulong *)(NumericHelper::POWERS_OF_TEN +
                    (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8)) +
          (ulong)((uint)input >> 0x1f);
  msg = (string *)
        ((lVar2 / 2 + (long)input) /
        (long)*(ulong *)(NumericHelper::POWERS_OF_TEN +
                        (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8));
  bVar1 = Hugeint::TryConvert<int>((int32_t)msg,result);
  params_1 = (PhysicalType)lVar2;
  if (!bVar1) {
    local_68._0_8_ = local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Failed to cast decimal value %d to type %s","");
    Exception::ConstructMessage<long,duckdb::PhysicalType>(&local_48,&local_68,msg,0xcc,params_1);
    if ((undefined1 *)local_68._0_8_ != local_58) {
      operator_delete((void *)local_68._0_8_);
    }
    HandleCastError::AssignError(&local_48,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return bVar1;
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}